

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O1

int __thiscall
CVmObjFile::getp_set_pos_end(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ulong *puVar1;
  long lVar2;
  long *plVar3;
  int iVar4;
  
  if (getp_set_pos_end(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_set_pos_end();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,argc,&getp_set_pos_end::desc);
  if (iVar4 == 0) {
    check_valid_file(this);
    lVar2 = *(long *)((this->super_CVmObject).ext_ + 0x20);
    if (lVar2 != 0) {
      *(undefined8 *)(lVar2 + 8) = 0;
    }
    puVar1 = (ulong *)((this->super_CVmObject).ext_ + 0x18);
    *puVar1 = *puVar1 & 0xfffffffffffffffd;
    plVar3 = *(long **)((this->super_CVmObject).ext_ + 8);
    (**(code **)(*plVar3 + 0x40))(plVar3,0,2);
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_set_pos_end(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                 uint *argc)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* make sure we are allowed to perform operations on the file */
    check_valid_file(vmg0_);

    /* note the seeking operation */
    note_file_seek(vmg_ TRUE);

    /* seek to the end position */
    get_ext()->fp->seek(0, OSFSK_END);

    /* no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}